

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createAlloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  RWNode *pRVar4;
  DataLayout *DL;
  Instruction *pIVar5;
  CallInst *I;
  Instruction *pIVar6;
  GenericDefSite<dg::dda::RWNode> local_48;
  
  pRVar4 = ReadWriteGraph::create(&this->graph,ALLOC);
  pIVar6 = Inst;
  do {
    pIVar6 = *(Instruction **)(pIVar6 + 8);
    if (pIVar6 == (Instruction *)0x0) break;
    I = *(CallInst **)(pIVar6 + 0x18);
    if (I == (CallInst *)0x0 || I[0x10] != (CallInst)0x3c) {
      if ((((I[0x10] != (CallInst)0x53) || (bVar2 = llvm::IntrinsicInst::classof(I), !bVar2)) ||
          (uVar3 = *(int *)(*(long *)(I + -0x20) + 0x24) - 0xbf, 5 < uVar3)) ||
         ((0x2dU >> (uVar3 & 0x1f) & 1) == 0)) {
        I = (CallInst *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if (I != (CallInst *)0x0) {
        uVar3 = *(int *)(*(long *)(I + -0x20) + 0x24) - 0xbf;
        if (uVar3 < 6) {
          pIVar5 = (Instruction *)0x0;
          if ((0x29U >> (uVar3 & 0x1f) & 1) != 0) {
            pIVar5 = *(Instruction **)(I + (0x20 - (ulong)(uint)(*(int *)(I + 0x14) << 5)));
          }
        }
        else {
          pIVar5 = (Instruction *)0x0;
        }
        if (pIVar5 == Inst) {
          pRVar4->has_address_taken = true;
          bVar2 = true;
          bVar1 = false;
        }
      }
      if (bVar1) {
LAB_00110734:
        bVar2 = false;
      }
    }
    else {
      if (*(Instruction **)(I + -0x40) != Inst) goto LAB_00110734;
      pRVar4->has_address_taken = true;
      bVar2 = true;
    }
  } while (!bVar2);
  if ((Inst != (Instruction *)0x0) && (Inst[0x10] == (Instruction)0x3a)) {
    DL = (DataLayout *)llvm::Module::getDataLayout();
    local_48.len.offset = llvmutils::getAllocatedSize((AllocaInst *)Inst,DL);
    (pRVar4->super_SubgraphNode<dg::dda::RWNode>).size = local_48.len.offset;
    if (pRVar4->has_address_taken == false) {
      if (local_48.len.offset == 0) {
        local_48.len.offset = Offset::UNKNOWN;
      }
      local_48.offset.offset = 0;
      local_48.target = pRVar4;
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  *)&(pRVar4->annotations).overwrites,&local_48);
    }
  }
  return pRVar4;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    using namespace llvm;

    RWNode &node = create(RWNodeType::ALLOC);

    // check if the address of this alloca is taken
    for (auto I = Inst->use_begin(), E = Inst->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        auto *use = *I;
#else
        auto *use = I->getUser();
#endif
        if (auto *S = dyn_cast<StoreInst>(use)) {
            if (S->getValueOperand() == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (auto *MI = dyn_cast<MemIntrinsic>(use)) {
            if (getMemIntrinsicValueOp(MI) == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (const auto *I = dyn_cast<Instruction>(Inst)) {
            assert(!I->mayWriteToMemory() &&
                   "Unhandled memory-writing instruction");
            (void) I; // c++17 TODO: replace with [[maybe_unused]]
        }
    }

    if (const AllocaInst *AI = dyn_cast<AllocaInst>(Inst)) {
        auto size = llvmutils::getAllocatedSize(AI, getDataLayout());
        node.setSize(size);
        // this is a alloca that does not have the address taken,
        // therefore we must always access the last instance in loads
        // (even in recursive functions) and may terminate the search
        // for definitions of this alloca at this alloca
        if (!node.hasAddressTaken()) {
            node.addOverwrites(&node, 0, size > 0 ? size : Offset::UNKNOWN);
        }
    }
    return &node;
}